

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int ffvcfm(fitsfile *gfptr,int xtensionCol,int extnameCol,int extverCol,int positionCol,
          int locationCol,int uriCol,int *status)

{
  int iVar1;
  char *err_message;
  int typecode;
  int local_44;
  long local_40;
  long local_38;
  
  local_44 = 0;
  local_40 = 0;
  local_38 = 0;
  if (*status != 0) {
    return *status;
  }
  if (xtensionCol == 0) {
LAB_001bc485:
    if (extnameCol != 0) {
      ffgtcl(gfptr,extnameCol,&local_44,&local_40,&local_38,status);
      iVar1 = *status;
      if ((iVar1 != 0) || (local_44 != 0x10)) {
        err_message = "Wrong format for Grouping name col. (ffvcfm)";
        goto LAB_001bc63d;
      }
      err_message = "Wrong format for Grouping name col. (ffvcfm)";
      if ((0x20 < local_40) || (local_40 != local_38)) goto LAB_001bc641;
    }
    if (extverCol != 0) {
      ffgtcl(gfptr,extverCol,&local_44,&local_40,&local_38,status);
      iVar1 = *status;
      if (((iVar1 != 0) || (local_44 != 0x29)) || (1 < local_40)) {
        err_message = "Wrong format for Grouping version col. (ffvcfm)";
        goto LAB_001bc63d;
      }
    }
    if (positionCol != 0) {
      ffgtcl(gfptr,positionCol,&local_44,&local_40,&local_38,status);
      iVar1 = *status;
      if (((iVar1 != 0) || (local_44 != 0x29)) || (1 < local_40)) {
        err_message = "Wrong format for Grouping position col. (ffvcfm)";
        goto LAB_001bc63d;
      }
    }
    if (locationCol != 0) {
      ffgtcl(gfptr,locationCol,&local_44,&local_40,&local_38,status);
      iVar1 = *status;
      if ((iVar1 != 0) || (local_44 != 0x10)) {
        err_message = "Wrong format for Grouping location col. (ffvcfm)";
        goto LAB_001bc63d;
      }
      err_message = "Wrong format for Grouping location col. (ffvcfm)";
      if ((0x100 < local_40) || (local_40 != local_38)) goto LAB_001bc641;
    }
    if (uriCol == 0) goto LAB_001bc64c;
    ffgtcl(gfptr,uriCol,&local_44,&local_40,&local_38,status);
    iVar1 = *status;
    if ((iVar1 != 0) || (local_44 != 0x10)) {
      err_message = "Wrong format for Grouping URI col. (ffvcfm)";
      goto LAB_001bc63d;
    }
    err_message = "Wrong format for Grouping URI col. (ffvcfm)";
    if ((local_40 < 4) && (local_40 == local_38)) goto LAB_001bc64c;
LAB_001bc641:
    *status = 0x154;
  }
  else {
    ffgtcl(gfptr,xtensionCol,&local_44,&local_40,&local_38,status);
    iVar1 = *status;
    if ((iVar1 == 0) && (local_44 == 0x10)) {
      err_message = "Wrong format for Grouping xtension col. (ffvcfm)";
      if ((local_40 < 9) && (local_40 == local_38)) goto LAB_001bc485;
      goto LAB_001bc641;
    }
    err_message = "Wrong format for Grouping xtension col. (ffvcfm)";
LAB_001bc63d:
    if (iVar1 == 0) goto LAB_001bc641;
  }
  ffpmsg(err_message);
LAB_001bc64c:
  return *status;
}

Assistant:

int ffvcfm(fitsfile *gfptr, int xtensionCol, int extnameCol, int extverCol,
	   int positionCol, int locationCol, int uriCol, int *status)
{
/*
   Perform validation on column formats to ensure this matches the grouping
   format the get functions expect.  Particularly want to check widths of
   string columns.
*/

   int typecode=0;
   long repeat=0, width=0;
   
   if (*status != 0) return (*status);
   
   do {
       if (xtensionCol)
       {
          fits_get_coltype(gfptr, xtensionCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TSTRING || repeat != width || repeat > 8)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping xtension col. (ffvcfm)");
             continue;
          }          
       }
       if (extnameCol)
       {
          fits_get_coltype(gfptr, extnameCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TSTRING || repeat != width || repeat > 32)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping name col. (ffvcfm)");
             continue;
          }          
       }
       if (extverCol)
       {
          fits_get_coltype(gfptr, extverCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TINT32BIT ||  repeat > 1)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping version col. (ffvcfm)");
             continue;
          }          
       }
       if (positionCol)
       {
          fits_get_coltype(gfptr, positionCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TINT32BIT ||  repeat > 1)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping position col. (ffvcfm)");
             continue;
          }          
       }
       if (locationCol)
       {
          fits_get_coltype(gfptr, locationCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TSTRING || repeat != width || repeat > 256)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping location col. (ffvcfm)");
             continue;
          }          
       }
       if (uriCol)
       {
          fits_get_coltype(gfptr, uriCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TSTRING || repeat != width || repeat > 3)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping URI col. (ffvcfm)");
             continue;
          }          
       }
   } while (0);
   return (*status);
}